

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Compiler::CaptureLiterals(Compiler *this,Node *root,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Recycler *this_00;
  char16_t *ptr;
  undefined4 *puVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  uVar3 = (*root->_vptr_Node[3])(root);
  uVar4 = (**root->_vptr_Node)(root);
  if (uVar3 < uVar4) {
    Js::Throw::OutOfMemory();
  }
  if (uVar3 == 0) {
    ptr = (char16_t *)0x0;
  }
  else {
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_a51452d;
    data.filename._0_4_ = 0x11c6;
    data.plusSize = (ulong)uVar3;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_58);
    ptr = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                    ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)uVar3);
  }
  Memory::WriteBarrierPtr<char16_t>::WriteBarrierSet(&(this->program->rep).insts.litbuf,ptr);
  (this->program->rep).insts.litbufLen = 0;
  (*root->_vptr_Node[4])(root,this,litbuf);
  if ((this->program->rep).insts.litbufLen != uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x11ca,"(program->rep.insts.litbufLen == finalLen)",
                       "program->rep.insts.litbufLen == finalLen");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void Compiler::CaptureLiterals(Node* root, const Char* litbuf)
    {
        // Program will own literal buffer. Prepare buffer and nodes for case-invariant matching if necessary.
        CharCount finalLen = root->TransferPass0(*this, litbuf);
        if (finalLen < root->LiteralLength()) // overflowed
        {
            Js::Throw::OutOfMemory();
        }

        program->rep.insts.litbuf = finalLen == 0 ? 0 : RecyclerNewArrayLeaf(scriptContext->GetRecycler(), Char, finalLen);

        program->rep.insts.litbufLen = 0;
        root->TransferPass1(*this, litbuf);
        Assert(program->rep.insts.litbufLen == finalLen);
    }